

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O0

ZyanStatus ZydisFormatterBufferRemember(ZydisFormatterBuffer *buffer,ZyanUPointer *state)

{
  ZyanUPointer *state_local;
  ZydisFormatterBuffer *buffer_local;
  
  if ((buffer == (ZydisFormatterBuffer *)0x0) || (state == (ZyanUPointer *)0x0)) {
    buffer_local._4_4_ = 0x80100004;
  }
  else {
    if (buffer->is_token_list == '\0') {
      *state = (buffer->string).vector.size;
    }
    else {
      *state = (ZyanUPointer)(buffer->string).vector.data;
    }
    buffer_local._4_4_ = 0x100000;
  }
  return buffer_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterBufferRemember(const ZydisFormatterBuffer* buffer, ZyanUPointer* state)
{
    if (!buffer || !state)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (buffer->is_token_list)
    {
        *state = (ZyanUPointer)buffer->string.vector.data;
    } else
    {
        *state = (ZyanUPointer)buffer->string.vector.size;
    }

    return ZYAN_STATUS_SUCCESS;
}